

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::ShaderToPrimSpec(UsdTransform2d *node,PrimSpec *ps,string *warn,string *err)

{
  PropertyMap *pPVar1;
  PrimSpec *pPVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  value_type *pvVar6;
  _Base_ptr p_Var7;
  ostringstream ss_e;
  Property prop;
  allocator local_c61;
  PrimSpec *local_c60;
  string local_c58;
  string local_c38;
  optional<tinyusdz::Property> local_c18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  local_630;
  
  Property::Property((Property *)&local_630);
  bVar3 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                    (&node->in,(Property *)&local_630,err);
  local_c60 = ps;
  if (bVar3) {
    ::std::__cxx11::string::string((string *)&local_c18,"inputs:in",(allocator *)&local_c58);
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](&ps->_props,(key_type *)&local_c18);
    Property::operator=(pmVar4,(Property *)&local_630);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_c18);
    poVar5 = ::std::operator<<((ostream *)&local_c18,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ShaderToPrimSpec");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x903);
    ::std::operator<<(poVar5," ");
    ::std::__cxx11::string::string
              ((string *)&local_c38,"Convert {} to Property failed.\n",&local_c61);
    fmt::format<char[10]>(&local_c58,&local_c38,(char (*) [10])"inputs:in");
    poVar5 = ::std::operator<<((ostream *)&local_c18,(string *)&local_c58);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_c18);
  }
  Property::~Property((Property *)&local_630);
  if (bVar3) {
    Property::Property((Property *)&local_630);
    bVar3 = anon_unknown_6::ToProperty<float>(&node->rotation,(Property *)&local_630,err);
    if (bVar3) {
      pPVar1 = &local_c60->_props;
      ::std::__cxx11::string::string((string *)&local_c18,"inputs:rotation",(allocator *)&local_c58)
      ;
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](pPVar1,(key_type *)&local_c18);
      Property::operator=(pmVar4,(Property *)&local_630);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_c18);
      poVar5 = ::std::operator<<((ostream *)&local_c18,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ShaderToPrimSpec");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x904);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)&local_c38,"Convert {} to Property failed.\n",&local_c61);
      fmt::format<char[16]>(&local_c58,&local_c38,(char (*) [16])"inputs:rotation");
      poVar5 = ::std::operator<<((ostream *)&local_c18,(string *)&local_c58);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_c18);
    }
    Property::~Property((Property *)&local_630);
    if (bVar3) {
      Property::Property((Property *)&local_630);
      bVar3 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                        (&node->scale,(Property *)&local_630,err);
      if (bVar3) {
        pPVar1 = &local_c60->_props;
        ::std::__cxx11::string::string((string *)&local_c18,"inputs:scale",(allocator *)&local_c58);
        pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](pPVar1,(key_type *)&local_c18);
        Property::operator=(pmVar4,(Property *)&local_630);
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_c18);
        poVar5 = ::std::operator<<((ostream *)&local_c18,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ShaderToPrimSpec");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x905);
        ::std::operator<<(poVar5," ");
        ::std::__cxx11::string::string
                  ((string *)&local_c38,"Convert {} to Property failed.\n",&local_c61);
        fmt::format<char[13]>(&local_c58,&local_c38,(char (*) [13])"inputs:scale");
        poVar5 = ::std::operator<<((ostream *)&local_c18,(string *)&local_c58);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_c18);
      }
      Property::~Property((Property *)&local_630);
      if (bVar3) {
        Property::Property((Property *)&local_630);
        bVar3 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                          (&node->translation,(Property *)&local_630,err);
        if (bVar3) {
          pPVar1 = &local_c60->_props;
          ::std::__cxx11::string::string
                    ((string *)&local_c18,"inputs:translation",(allocator *)&local_c58);
          pmVar4 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](pPVar1,(key_type *)&local_c18);
          Property::operator=(pmVar4,(Property *)&local_630);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_c18);
          poVar5 = ::std::operator<<((ostream *)&local_c18,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ShaderToPrimSpec");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x906);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&local_c38,"Convert {} to Property failed.\n",&local_c61);
          fmt::format<char[19]>(&local_c58,&local_c38,(char (*) [19])"inputs:translation");
          poVar5 = ::std::operator<<((ostream *)&local_c18,(string *)&local_c58);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_c18);
        }
        Property::~Property((Property *)&local_630);
        if (bVar3) {
          if ((node->result)._authored == false) {
            local_c18.has_value_ = false;
            memset(&local_c18.contained,0,0x5e0);
          }
          else {
            Property::Property((Property *)&local_630);
            if ((node->result)._actual_type_name._M_string_length == 0) {
              tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
              Property::MakeEmptyAttrib((Property *)&local_c18,&local_c58,false);
              Property::operator=((Property *)&local_630,(Property *)&local_c18);
              Property::~Property((Property *)&local_c18);
              ::std::__cxx11::string::_M_dispose();
            }
            else {
              Property::MakeEmptyAttrib
                        ((Property *)&local_c18,&(node->result)._actual_type_name,false);
              Property::operator=((Property *)&local_630,(Property *)&local_c18);
              Property::~Property((Property *)&local_c18);
            }
            nonstd::optional_lite::optional<tinyusdz::Property>::optional<tinyusdz::Property,_0>
                      (&local_c18,(Property *)&local_630);
            Property::~Property((Property *)&local_630);
          }
          nonstd::optional_lite::optional<tinyusdz::Property>::optional<tinyusdz::Property,_0>
                    ((optional<tinyusdz::Property> *)&local_630,&local_c18);
          nonstd::optional_lite::optional<tinyusdz::Property>::~optional(&local_c18);
          if ((char)local_630.first._M_dataplus._M_p == '\x01') {
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::Property>::value
                               ((optional<tinyusdz::Property> *)&local_630);
            pPVar1 = &local_c60->_props;
            ::std::__cxx11::string::string
                      ((string *)&local_c18,"outputs:result",(allocator *)&local_c58);
            pmVar4 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](pPVar1,(key_type *)&local_c18);
            Property::operator=(pmVar4,pvVar6);
            ::std::__cxx11::string::_M_dispose();
          }
          nonstd::optional_lite::optional<tinyusdz::Property>::~optional
                    ((optional<tinyusdz::Property> *)&local_630);
          pPVar1 = &local_c60->_props;
          for (p_Var7 = *(_Base_ptr *)
                         ((long)&(node->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                                 super__Rb_tree_header._M_header + 0x10);
              (_Rb_tree_header *)p_Var7 !=
              &(node->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
            ::std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            ::pair(&local_630,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
                    *)(p_Var7 + 1));
            pmVar4 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](pPVar1,&local_630.first);
            Property::operator=(pmVar4,&local_630.second);
            ::std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            ::~pair(&local_630);
          }
          Token::Token((Token *)&local_c58,"UsdTransform2d");
          Attribute::Uniform<tinyusdz::Token>((Attribute *)&local_c18,(Token *)&local_c58);
          Property::Property((Property *)&local_630,(Attribute *)&local_c18,false);
          ::std::__cxx11::string::string((string *)&local_c38,"info:id",&local_c61);
          pmVar4 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](pPVar1,&local_c38);
          Property::operator=(pmVar4,(Property *)&local_630);
          ::std::__cxx11::string::_M_dispose();
          Property::~Property((Property *)&local_630);
          Attribute::~Attribute((Attribute *)&local_c18);
          ::std::__cxx11::string::_M_dispose();
          pPVar2 = local_c60;
          PrimMetas::operator=(&local_c60->_metas,&(node->super_ShaderNode).super_UsdShadePrim.meta)
          ;
          ::std::__cxx11::string::_M_assign((string *)&pPVar2->_name);
          pPVar2->_specifier = (node->super_ShaderNode).super_UsdShadePrim.spec;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ShaderToPrimSpec(const UsdTransform2d &node, PrimSpec &ps,
                      std::string *warn, std::string *err) {
  (void)warn;

#define TO_PROPERTY(__prop_name, __v)                                    \
  {                                                                      \
    Property prop;                                                       \
    if (!ToProperty(__v, prop, err)) {                                   \
      PUSH_ERROR_AND_RETURN(                                             \
          fmt::format("Convert {} to Property failed.\n", __prop_name)); \
    }                                                                    \
    ps.props()[__prop_name] = prop;                                      \
  }

  // inputs
  TO_PROPERTY("inputs:in", node.in)
  TO_PROPERTY("inputs:rotation", node.rotation)
  TO_PROPERTY("inputs:scale", node.scale)
  TO_PROPERTY("inputs:translation", node.translation)

  // outputs
  if (auto pv = TypedTerminalAttributeToProperty(node.result)) {
    ps.props()["outputs:result"] = pv.value();
  }

  for (auto prop : node.props) {
    ps.props()[prop.first] = prop.second;
  }

  ps.props()[kInfoId] =
      Property(Attribute::Uniform(value::token(kUsdTransform2d)));
  ps.metas() = node.metas();
  ps.name() = node.name;
  ps.specifier() = node.spec;

  return true;
}